

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.cpp
# Opt level: O0

void * __thiscall dic::dict_find(dic *this,int dictidx,int tableidx,void *key)

{
  dictEntry **ppdVar1;
  uint uVar2;
  int iVar3;
  reference pvVar4;
  dictEntry *local_30;
  dictEntry *fetch;
  void *key_local;
  int tableidx_local;
  int dictidx_local;
  dic *this_local;
  
  pvVar4 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx);
  ppdVar1 = pvVar4->ht[tableidx].table;
  uVar2 = murmurhash2(key);
  local_30 = ppdVar1[uVar2];
  while( true ) {
    if (local_30 == (dictEntry *)0x0) {
      return (void *)0x0;
    }
    iVar3 = strcmp(*(char **)((long)local_30->key + 8),*(char **)((long)key + 8));
    if (iVar3 == 0) break;
    local_30 = local_30->next;
  }
  return local_30;
}

Assistant:

void * dic::dict_find(int dictidx,int tableidx,void *key){
    dictEntry *fetch=NULL; 
    fetch=dc[dictidx].ht[tableidx].table[dic::murmurhash2(key)]; 
    while(fetch!=NULL)
    {
        if(strcmp((char *)((const robj *)fetch->key)->ptr,(char *)((const robj *)key)->ptr)==0)
            return (void *)fetch;
        fetch=fetch->next;
    }    

    return NULL;
}